

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

void vkt::api::anon_unknown_1::addCases<vkt::api::(anonymous_namespace)::ImageView>
               (MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *group,
               CaseDescription<vkt::api::(anonymous_namespace)::ImageView> *cases)

{
  char *__s;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Parameters arg0;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  TestCaseGroup *group_00;
  undefined4 local_8c;
  undefined4 uStack_88;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  NamedParameters<vkt::api::(anonymous_namespace)::ImageView> *local_20;
  NamedParameters<vkt::api::(anonymous_namespace)::ImageView> *cur;
  CaseDescription<vkt::api::(anonymous_namespace)::ImageView> *cases_local;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *group_local;
  
  cur = (NamedParameters<vkt::api::(anonymous_namespace)::ImageView> *)cases;
  cases_local = (CaseDescription<vkt::api::(anonymous_namespace)::ImageView> *)group;
  for (local_20 = cases->paramsBegin;
      local_20 !=
      *(NamedParameters<vkt::api::(anonymous_namespace)::ImageView> **)
       &(cur->parameters).image.format; local_20 = local_20 + 1) {
    group_00 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
               ::get((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                     cases_local);
    __s = local_20->name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_79);
    uVar1 = (local_20->parameters).subresourceRange.levelCount;
    uVar2 = (local_20->parameters).subresourceRange.baseArrayLayer;
    uVar3 = (local_20->parameters).subresourceRange.layerCount;
    arg0.subresourceRange.layerCount = uVar3;
    arg0.subresourceRange.baseArrayLayer = uVar2;
    uVar4 = (local_20->parameters).subresourceRange.baseMipLevel;
    uVar5 = (local_20->parameters).image.flags;
    uVar6 = (local_20->parameters).image.imageType;
    uVar7 = (local_20->parameters).image.format;
    uVar8 = (local_20->parameters).image.extent.width;
    uVar9 = (local_20->parameters).image.extent.height;
    uVar10 = (local_20->parameters).image.extent.depth;
    arg0.image.extent.depth = uVar10;
    arg0.image.extent.height = uVar9;
    arg0.image.extent.width = uVar8;
    uVar11 = (local_20->parameters).image.mipLevels;
    uVar12 = (local_20->parameters).image.arraySize;
    uVar13 = (local_20->parameters).image.samples;
    uVar14 = (local_20->parameters).image.tiling;
    uVar15 = (local_20->parameters).image.usage;
    uVar16 = (local_20->parameters).image.initialLayout;
    arg0.image.initialLayout = uVar16;
    arg0.image.usage = uVar15;
    arg0.image.tiling = uVar14;
    arg0.image.samples = uVar13;
    arg0.image.arraySize = uVar12;
    arg0.image.mipLevels = uVar11;
    arg0.image.format = uVar7;
    arg0.image.imageType = uVar6;
    arg0.image.flags = uVar5;
    uVar17 = (local_20->parameters).viewType;
    uVar18 = (local_20->parameters).format;
    uVar19 = (local_20->parameters).components.r;
    uVar20 = (local_20->parameters).components.g;
    uVar21 = (local_20->parameters).components.b;
    uVar22 = (local_20->parameters).components.a;
    arg0.components.a = uVar22;
    arg0.components.b = uVar21;
    arg0.components.g = uVar20;
    arg0.components.r = uVar19;
    uVar23 = (local_20->parameters).subresourceRange.aspectMask;
    arg0.subresourceRange.aspectMask = uVar23;
    arg0.format = uVar18;
    arg0.viewType = uVar17;
    arg0.subresourceRange.baseMipLevel = uVar4;
    arg0.subresourceRange.levelCount = uVar1;
    addFunctionCase<vkt::api::(anonymous_namespace)::ImageView::Parameters>
              (group_00,&local_40,&local_78,(Function)cur->name,arg0);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  return;
}

Assistant:

void addCases (const MovePtr<tcu::TestCaseGroup>& group, const CaseDescription<Object>& cases)
{
	for (const NamedParameters<Object>* cur = cases.paramsBegin; cur != cases.paramsEnd; ++cur)
		addFunctionCase(group.get(), cur->name, "", cases.function, cur->parameters);
}